

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O3

_Bool Hacl_RSAPSS_rsapss_skey_sign
                (Spec_Hash_Definitions_hash_alg a,uint32_t modBits,uint32_t eBits,uint32_t dBits,
                uint8_t *nb,uint8_t *eb,uint8_t *db,uint32_t saltLen,uint8_t *salt,uint32_t msgLen,
                uint8_t *msg,uint8_t *sgnt)

{
  uint64_t *puVar1;
  long lVar2;
  uint64_t uVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint32_t len;
  Spec_Hash_Definitions_hash_alg a_00;
  _Bool _Var7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  ulong uVar11;
  undefined4 in_register_00000034;
  uint uVar12;
  undefined7 in_register_00000039;
  uint64_t *pkey;
  uint64_t *res;
  uint uVar13;
  uint64_t *res_00;
  undefined8 auStack_a0 [2];
  ulong auStack_90 [3];
  uint64_t auStack_78 [2];
  uint8_t *local_68;
  uint8_t *local_60;
  undefined8 local_58;
  uint64_t *local_50;
  undefined8 local_48;
  uint32_t local_3c;
  undefined4 local_38;
  uint local_34;
  
  local_48 = CONCAT44(in_register_00000034,modBits);
  local_58 = CONCAT44(in_register_00000014,eBits);
  auStack_78[1] = CONCAT44(in_register_0000000c,dBits);
  local_38 = (undefined4)CONCAT71(in_register_00000039,a);
  local_34 = modBits - 1;
  uVar13 = local_34 >> 6;
  uVar12 = (eBits - 1 >> 6) + uVar13 * 2;
  uVar11 = (ulong)(((dBits - 1 >> 6) + uVar12) * 8);
  lVar2 = -(uVar11 + 0x2f & 0xfffffffffffffff0);
  res = (uint64_t *)((long)auStack_78 + lVar2);
  local_68 = eb;
  local_60 = nb;
  *(undefined8 *)((long)auStack_90 + lVar2 + 0x10) = 0x165fea;
  memset(res,0,uVar11 + 0x20);
  puVar4 = local_60;
  local_3c = (dBits - 1 >> 3) + 1;
  local_50 = res + (ulong)uVar12 + 3;
  uVar12 = local_34 >> 3;
  uVar11 = (ulong)(uVar13 * 8 + 8);
  puVar1 = (uint64_t *)(uVar11 + (long)res);
  res_00 = (uint64_t *)(uVar11 + (long)puVar1);
  *(undefined8 *)((long)auStack_90 + lVar2 + 0x10) = 0x166032;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar12 + 1,puVar4,res);
  uVar12 = local_34;
  uVar5 = local_58;
  *(undefined8 *)((long)auStack_90 + lVar2 + 0x10) = 0x166047;
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(uVar13 + 1,uVar12,res,puVar1);
  puVar4 = local_68;
  *(undefined8 *)((long)auStack_90 + lVar2 + 0x10) = 0x166055;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64((eBits - 1 >> 3) + 1,puVar4,res_00);
  uVar6 = local_48;
  *(undefined8 *)((long)auStack_90 + lVar2 + 0x10) = 0x166061;
  uVar8 = check_modulus_u64((uint32_t)uVar6,res);
  *(undefined8 *)((long)auStack_90 + lVar2 + 0x10) = 0x16606f;
  uVar9 = check_exponent_u64((uint32_t)uVar5,res_00);
  len = local_3c;
  puVar1 = local_50;
  uVar3 = auStack_78[1];
  *(undefined8 *)((long)auStack_90 + lVar2 + 0x10) = 0x16608c;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(len,db,puVar1);
  *(undefined8 *)((long)auStack_90 + lVar2 + 0x10) = 0x166096;
  uVar10 = check_exponent_u64((uint32_t)uVar3,puVar1);
  uVar6 = local_48;
  if ((uVar9 & uVar8) == 0xffffffffffffffff) {
    _Var7 = false;
    if (uVar10 == 0xffffffffffffffff) {
      a_00 = (Spec_Hash_Definitions_hash_alg)local_38;
      *(uint8_t **)((long)auStack_90 + lVar2 + 0x10) = sgnt;
      *(uint8_t **)((long)auStack_90 + lVar2 + 8) = msg;
      *(ulong *)((long)auStack_90 + lVar2) = (ulong)msgLen;
      *(uint8_t **)((long)auStack_a0 + lVar2 + 8) = salt;
      *(undefined8 *)((long)auStack_a0 + lVar2) = 0x1660cd;
      _Var7 = Hacl_RSAPSS_rsapss_sign
                        (a_00,(uint32_t)uVar6,(uint32_t)uVar5,(uint32_t)uVar3,res,saltLen,
                         *(uint8_t **)((long)auStack_a0 + lVar2 + 8),
                         *(uint32_t *)((long)auStack_90 + lVar2),
                         *(uint8_t **)((long)auStack_90 + lVar2 + 8),
                         *(uint8_t **)((long)auStack_90 + lVar2 + 0x10));
    }
  }
  else {
    _Var7 = false;
  }
  return _Var7;
}

Assistant:

bool
Hacl_RSAPSS_rsapss_skey_sign(
  Spec_Hash_Definitions_hash_alg a,
  uint32_t modBits,
  uint32_t eBits,
  uint32_t dBits,
  uint8_t *nb,
  uint8_t *eb,
  uint8_t *db,
  uint32_t saltLen,
  uint8_t *salt,
  uint32_t msgLen,
  uint8_t *msg,
  uint8_t *sgnt
)
{
  KRML_CHECK_SIZE(sizeof (uint64_t),
    2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U + (dBits - 1U) / 64U + 1U);
  uint64_t
  skey[2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U + (dBits - 1U) / 64U + 1U];
  memset(skey,
    0U,
    (2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U + (dBits - 1U) / 64U + 1U)
    * sizeof (uint64_t));
  bool b = load_skey(modBits, eBits, dBits, nb, eb, db, skey);
  if (b)
  {
    return
      Hacl_RSAPSS_rsapss_sign(a,
        modBits,
        eBits,
        dBits,
        skey,
        saltLen,
        salt,
        msgLen,
        msg,
        sgnt);
  }
  return false;
}